

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void __thiscall SSTable::~SSTable(SSTable *this)

{
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this_00;
  _Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *this_01;
  
  operator_delete(this->header,0x20);
  this_00 = this->data;
  if (this_00 != (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)0x0) {
    std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(this_00);
  }
  operator_delete(this_00,0x18);
  this_01 = &this->index->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>;
  if (this_01 != (_Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *)0x0) {
    std::_Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::~_Vector_base(this_01);
  }
  operator_delete(this_01,0x18);
  std::filesystem::__cxx11::path::~path(&this->file);
  return;
}

Assistant:

SSTable::~SSTable() {
    delete header;
    delete data;
    delete index;
}